

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_utc_timestamp_field_with_milliseconds_Test::TestBody
          (writer_test_should_write_utc_timestamp_field_with_milliseconds_Test *this)

{
  char **this_00;
  bool bVar1;
  time_t time;
  char *message;
  Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *field_00;
  AssertHelper local_268;
  Message local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  ostringstream local_218 [8];
  ostringstream oss;
  optional<int> local_9c;
  int local_94;
  optional<int> local_90;
  Time local_88;
  time_t local_70;
  time_t ts;
  tm tm;
  Field field;
  writer_test_should_write_utc_timestamp_field_with_milliseconds_Test *this_local;
  
  this_00 = &tm.tm_zone;
  Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>::Field
            ((Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *)this_00);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  tm.tm_gmtoff = 0;
  tm.tm_hour = 4;
  tm.tm_mday = 0x75;
  tm.tm_sec = 0xd;
  tm.tm_min = 0x10;
  ts = 0x2d0000001e;
  time = mkgmtime((tm *)&ts);
  local_94 = 0x7b;
  local_70 = time;
  std::optional<int>::optional<int,_true>(&local_90,&local_94);
  std::optional<int>::optional(&local_9c);
  Fixpp::Type::UTCTimestamp::Time::Time(&local_88,time,local_90,local_9c);
  Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>::set<Fixpp::Type::UTCTimestamp::Time>
            ((Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *)this_00,&local_88);
  std::__cxx11::ostringstream::ostringstream(local_218);
  Fixpp::writeField<Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>>
            ((Fixpp *)local_218,(ostream *)this_00,field_00);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[26]>
            ((EqHelper<false> *)local_238,"oss.str()","\"52=20170516-13:45:30.123|\"",&local_258,
             (char (*) [26])"52=20170516-13:45:30.123|");
  std::__cxx11::string::~string((string *)&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0xa3,message);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::__cxx11::ostringstream::~ostringstream(local_218);
  return;
}

Assistant:

TEST(writer_test, should_write_utc_timestamp_field_with_milliseconds)
{
    using Field = Fixpp::Field<Fixpp::Tag::SendingTime>;
    Field field;

    std::tm tm{};
    tm.tm_year = 117;
    tm.tm_mon = 4;
    tm.tm_mday = 16;
    tm.tm_hour = 13;
    tm.tm_min = 45;
    tm.tm_sec = 30;

    auto ts = mkgmtime(&tm);
    field.set(Fixpp::Type::UTCTimestamp::Time{ts, 123});

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "52=20170516-13:45:30.123|");
}